

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall el::Logger::flush(Logger *this,Level level,fstream_t *fs)

{
  TypedConfigurations *pTVar1;
  _Base_ptr p_Var2;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *psVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  bool bVar6;
  
  if (fs == (fstream_t *)0x0) {
    pTVar1 = this->m_typedConfigurations;
    (*(pTVar1->super_ThreadSafe)._vptr_ThreadSafe[2])(pTVar1);
    bVar6 = base::TypedConfigurations::unsafeGetConfigByVal<bool>
                      (pTVar1,level,&pTVar1->m_toFileMap,"toFile");
    if (!bVar6) {
      return;
    }
    pTVar1 = this->m_typedConfigurations;
    (*(pTVar1->super_ThreadSafe)._vptr_ThreadSafe[2])(pTVar1);
    psVar3 = base::TypedConfigurations::unsafeGetConfigByRef<std::shared_ptr<std::fstream>>
                       (pTVar1,level,&pTVar1->m_fileStreamMap,"fileStream");
    if ((psVar3->
        super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr == (element_type *)0x0) {
      return;
    }
  }
  std::ostream::flush();
  p_Var4 = (this->m_unflushedCount)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var5 = &(this->m_unflushedCount)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var5->_M_header;
    do {
      bVar6 = p_Var4[1]._M_color < level;
      if (!bVar6) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar6];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var5) && (p_Var2[1]._M_color <= level)) {
      *(undefined4 *)&p_Var2[1].field_0x4 = 0;
    }
  }
  return;
}

Assistant:

void Logger::flush(Level level, base::type::fstream_t* fs) {
  if (fs == nullptr && m_typedConfigurations->toFile(level)) {
    fs = m_typedConfigurations->fileStream(level);
  }
  if (fs != nullptr) {
    fs->flush();
    std::map<Level, unsigned int>::iterator iter = m_unflushedCount.find(level);
    if (iter != m_unflushedCount.end()) {
      iter->second = 0;
    }
  }
}